

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

cmDocumentationSection * __thiscall cmDocumentation::SectionAtName(cmDocumentation *this,char *name)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_bool>
  pVar1;
  char *local_58;
  cmDocumentationSection local_50;
  
  local_58 = name;
  cmDocumentationSection::cmDocumentationSection(&local_50,name);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
          ::_M_emplace_unique<char_const*&,cmDocumentationSection>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmDocumentationSection>,std::_Select1st<std::pair<std::__cxx11::string_const,cmDocumentationSection>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection>>>
                      *)&this->AllSections,&local_58,&local_50);
  cmDocumentationSection::~cmDocumentationSection(&local_50);
  return (cmDocumentationSection *)(pVar1.first._M_node._M_node + 2);
}

Assistant:

cmDocumentationSection& cmDocumentation::SectionAtName(const char* name)
{
  return this->AllSections.emplace(name, cmDocumentationSection{ name })
    .first->second;
}